

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Pop
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it)

{
  pointer *ppuVar1;
  pointer pSVar2;
  pointer pSVar3;
  iterator iVar4;
  PositionType PVar5;
  PositionType PVar6;
  iterator local_28;
  
  PVar5 = it.Position;
  local_28.Tree = it.Tree;
  pSVar2 = (this->Data).
           super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->Data).
           super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.Position = PVar5;
  if (pSVar2 == pSVar3) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0xa2,
                  "iterator cmLinkedTree<cmState::SnapshotDataType>::Pop(iterator) [T = cmState::SnapshotDataType]"
                 );
  }
  PVar6 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (PVar6 == ((long)pSVar3 - (long)pSVar2) / 0xe8) {
    iterator::operator++(&local_28);
    if (PVar6 == PVar5) {
      std::vector<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>::pop_back
                (&this->Data);
      ppuVar1 = &(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
    }
    iVar4.Position = local_28.Position;
    iVar4.Tree = local_28.Tree;
    return iVar4;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0xa3,
                "iterator cmLinkedTree<cmState::SnapshotDataType>::Pop(iterator) [T = cmState::SnapshotDataType]"
               );
}

Assistant:

iterator Pop(iterator it)
    {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast)
      {
      this->Data.pop_back();
      this->UpPositions.pop_back();
      }
    return it;
    }